

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

void __thiscall
pybind11::str::str<pybind11::detail::accessor_policies::str_attr>
          (str *this,accessor<pybind11::detail::accessor_policies::str_attr> *a)

{
  object local_20;
  accessor<pybind11::detail::accessor_policies::str_attr> *local_18;
  accessor<pybind11::detail::accessor_policies::str_attr> *a_local;
  str *this_local;
  
  local_18 = a;
  a_local = (accessor<pybind11::detail::accessor_policies::str_attr> *)this;
  detail::accessor::operator_cast_to_object((accessor *)&local_20);
  str(this,&local_20);
  object::~object(&local_20);
  return;
}

Assistant:

str(const char *c, const SzType &n)
        : object(PyUnicode_FromStringAndSize(c, ssize_t_cast(n)), stolen_t{}) {
        if (!m_ptr) {
            pybind11_fail("Could not allocate string object!");
        }
    }